

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_4.cpp
# Opt level: O3

optional<int> parse_and_evaluate(string *_expression)

{
  byte *pbVar1;
  long lVar2;
  undefined8 in_RAX;
  optional<int> oVar3;
  long lVar4;
  uint unaff_EBX;
  byte bVar5;
  char *pcVar6;
  ostream *poVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 uStack_28;
  
  pbVar1 = (byte *)(_expression->_M_dataplus)._M_p;
  bVar5 = *pbVar1;
  uStack_28 = in_RAX;
  if ((byte)(bVar5 - 0x3a) < 0xf6) {
    poVar7 = (ostream *)&std::cerr;
    pcVar6 = "Could not parse first number.\n";
    lVar4 = 0x1e;
  }
  else {
    unaff_EBX = 0;
    uVar8 = 0;
    do {
      uVar9 = uVar8;
      unaff_EBX = ((uint)bVar5 + unaff_EBX * 10) - 0x30;
      bVar5 = pbVar1[uVar9 + 1];
      uVar8 = uVar9 + 1;
    } while ((byte)(bVar5 - 0x30) < 10);
    uVar8 = 0x100000000;
    if (_expression->_M_string_length <= uVar9 + 1) goto LAB_00101485;
    bVar5 = bVar5 - 0x2a;
    if ((5 < bVar5) || ((0x2bU >> (bVar5 & 0x1f) & 1) == 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Failed to parse operator at offset: ",0x24);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      uStack_28._0_7_ = CONCAT16(10,(undefined6)uStack_28);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)((long)&uStack_28 + 6),1);
      goto LAB_00101485;
    }
    lVar4 = uVar9 + 2;
    if (0xf5 < (byte)(pbVar1[uVar9 + 2] - 0x3a)) {
      do {
        lVar2 = lVar4 + 1;
        lVar4 = lVar4 + 1;
      } while ((byte)(pbVar1[lVar2] - 0x30) < 10);
      oVar3.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
           (_Optional_base<int,_true,_true>)
           (*(code *)(&DAT_00102008 +
                     *(int *)(&DAT_00102008 + (ulong)*(uint *)(&DAT_00102048 + (ulong)bVar5 * 4) * 4
                             )))();
      return (optional<int>)
             oVar3.super__Optional_base<int,_true,_true>._M_payload.
             super__Optional_payload_base<int>;
    }
    unaff_EBX = 0x1050a0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to parse next operand at offset ",0x27);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    pcVar6 = (char *)((long)&uStack_28 + 7);
    uStack_28 = CONCAT17(10,(undefined7)uStack_28);
    lVar4 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,lVar4);
  uVar8 = 0;
LAB_00101485:
  return (optional<int>)(unaff_EBX | uVar8);
}

Assistant:

optional<number_type> parse_and_evaluate(string const& _expression)
{
	size_t parseOffset = 0;
	optional<number_type> const first_value = parse_number(_expression, parseOffset);
	if (!first_value.has_value())
	{
		cerr << "Could not parse first number.\n";
		return nullopt;
	}

	number_type result = first_value.value();

	while (parseOffset < _expression.size())
	{
		optional<Operator> const op = parse_operator(_expression, parseOffset);
		if (!op.has_value())
		{
			cerr << "Failed to parse operator at offset: " << parseOffset << '\n';
			break;
		}

		optional<number_type> const rhs = parse_number(_expression, parseOffset);
		if (!rhs.has_value())
		{
			cerr << "Failed to parse next operand at offset " << parseOffset << '\n';
			return nullopt;
		}

		switch (op.value())
		{
			case Operator::Plus:
				result = result + rhs.value();
				break;
			case Operator::Minus:
				result = result - rhs.value();
				break;
			case Operator::Multiply:
				result = result * rhs.value();
				break;
			case Operator::Divide:
				if (rhs.value() != 0)
					result = result / rhs.value();
				else
				{
					cerr << "Division by zero is undefined.\n";
					return nullopt;
				}
				break;
		}
	}
	return result;
}